

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void Convert16To8Row_SSSE3(uint16_t *src_y,uint8_t *dst_y,int scale,int width)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int width_local;
  int scale_local;
  uint8_t *dst_y_local;
  uint16_t *src_y_local;
  
  auVar22._0_4_ = CONCAT22((short)scale,(short)scale);
  auVar22._4_4_ = auVar22._0_4_;
  auVar22._8_4_ = auVar22._0_4_;
  auVar22._12_4_ = auVar22._0_4_;
  do {
    auVar20 = *(undefined1 (*) [16])src_y;
    pauVar1 = (undefined1 (*) [16])((long)src_y + 0x10);
    src_y = (uint16_t *)((long)src_y + 0x20);
    auVar20 = pmulhuw(auVar20,auVar22);
    auVar21 = pmulhuw(*pauVar1,auVar22);
    sVar3 = auVar20._0_2_;
    sVar4 = auVar20._2_2_;
    sVar5 = auVar20._4_2_;
    sVar6 = auVar20._6_2_;
    sVar7 = auVar20._8_2_;
    sVar8 = auVar20._10_2_;
    sVar9 = auVar20._12_2_;
    sVar10 = auVar20._14_2_;
    sVar11 = auVar21._0_2_;
    sVar12 = auVar21._2_2_;
    sVar13 = auVar21._4_2_;
    sVar14 = auVar21._6_2_;
    sVar15 = auVar21._8_2_;
    sVar16 = auVar21._10_2_;
    sVar17 = auVar21._12_2_;
    sVar18 = auVar21._14_2_;
    *dst_y = (0 < sVar3) * (sVar3 < 0x100) * auVar20[0] - (0xff < sVar3);
    dst_y[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar20[2] - (0xff < sVar4);
    dst_y[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar20[4] - (0xff < sVar5);
    dst_y[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar20[6] - (0xff < sVar6);
    dst_y[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar20[8] - (0xff < sVar7);
    dst_y[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar20[10] - (0xff < sVar8);
    dst_y[6] = (0 < sVar9) * (sVar9 < 0x100) * auVar20[0xc] - (0xff < sVar9);
    dst_y[7] = (0 < sVar10) * (sVar10 < 0x100) * auVar20[0xe] - (0xff < sVar10);
    dst_y[8] = (0 < sVar11) * (sVar11 < 0x100) * auVar21[0] - (0xff < sVar11);
    dst_y[9] = (0 < sVar12) * (sVar12 < 0x100) * auVar21[2] - (0xff < sVar12);
    dst_y[10] = (0 < sVar13) * (sVar13 < 0x100) * auVar21[4] - (0xff < sVar13);
    dst_y[0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar21[6] - (0xff < sVar14);
    dst_y[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar21[8] - (0xff < sVar15);
    dst_y[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar21[10] - (0xff < sVar16);
    dst_y[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar21[0xc] - (0xff < sVar17);
    dst_y[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar21[0xe] - (0xff < sVar18);
    dst_y = dst_y + 0x10;
    iVar19 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar19;
  } while (iVar19 != 0 && bVar2);
  return;
}

Assistant:

void Convert16To8Row_SSSE3(const uint16_t* src_y,
                           uint8_t* dst_y,
                           int scale,
                           int width) {
  // clang-format off
  asm volatile (
      "movd        %3,%%xmm2                     \n"
      "punpcklwd   %%xmm2,%%xmm2                 \n"
      "pshufd      $0x0,%%xmm2,%%xmm2            \n"

    // 32 pixels per loop.
    LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "add         $0x20,%0                      \n"
      "pmulhuw     %%xmm2,%%xmm0                 \n"
      "pmulhuw     %%xmm2,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "add         $0x10,%1                      \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
  : "+r"(src_y),   // %0
    "+r"(dst_y),   // %1
    "+r"(width)    // %2
  : "r"(scale)     // %3
  : "memory", "cc", "xmm0", "xmm1", "xmm2");
  // clang-format on
}